

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O0

size_t nhdp_domain_encode_mpr_tlvvalue(uint8_t *tlvvalue,size_t tlvsize,nhdp_link *lnk)

{
  list_entity *plVar1;
  ulong uVar2;
  char *pcVar3;
  char *in_stack_ffffffffffffff30;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t len;
  size_t byte_idx;
  size_t bit_idx;
  nhdp_domain *domain;
  nhdp_link *lnk_local;
  size_t tlvsize_local;
  uint8_t *tlvvalue_local;
  
  memset(tlvvalue,0,tlvsize);
  __tempptr = (list_entity *)0x0;
  if ((lnk->neigh_is_flooding_mpr & 1U) != 0) {
    *tlvvalue = *tlvvalue | 1;
  }
  plVar1 = _domain_list.next;
  if ((log_global_mask[LOG_NHDP_W] & 1) != 0) {
    in_stack_ffffffffffffff30 = "false";
    if ((lnk->neigh_is_flooding_mpr & 1U) != 0) {
      in_stack_ffffffffffffff30 = "true";
    }
    oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x31e,(void *)0x0,0,
             "Set flooding MPR: %s",in_stack_ffffffffffffff30);
    plVar1 = _domain_list.next;
  }
  while( true ) {
    if (plVar1->prev == _domain_list.prev) {
      return (size_t)__tempptr;
    }
    uVar2 = (ulong)(*(int *)((long)&plVar1[-0x27].next + 4) + 1 >> 3);
    if (tlvsize <= uVar2) break;
    if (__tempptr < (list_entity *)(uVar2 + 1)) {
      __tempptr = (list_entity *)(uVar2 + 1);
    }
    if ((lnk->neigh->_domaindata[*(int *)((long)&plVar1[-0x27].next + 4)].neigh_is_mpr & 1U) != 0) {
      tlvvalue[uVar2] =
           tlvvalue[uVar2] |
           (byte)(1 << ((char)*(undefined4 *)((long)&plVar1[-0x27].next + 4) + 1U & 7));
    }
    if ((log_global_mask[LOG_NHDP_W] & 1) != 0) {
      pcVar3 = "false";
      if ((lnk->neigh->_domaindata[*(int *)((long)&plVar1[-0x27].next + 4)].neigh_is_mpr & 1U) != 0)
      {
        pcVar3 = "true";
      }
      in_stack_ffffffffffffff30 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                            (uint)*(byte *)((long)&plVar1[-0x27].next + 1));
      oonf_log(LOG_SEVERITY_DEBUG,LOG_NHDP_W,"src/nhdp/nhdp/nhdp_domain.c",0x330,(void *)0x0,0,
               "Set routing MPR for domain %u: %s",in_stack_ffffffffffffff30,pcVar3);
    }
    plVar1 = plVar1->next;
  }
  return 0;
}

Assistant:

size_t
nhdp_domain_encode_mpr_tlvvalue(uint8_t *tlvvalue, size_t tlvsize, struct nhdp_link *lnk) {
  struct nhdp_domain *domain;
  size_t bit_idx, byte_idx, len;

  memset(tlvvalue, 0, tlvsize);
  len = 0;
  /* set flooding MPR flag */
  if (lnk->neigh_is_flooding_mpr) {
    tlvvalue[0] |= RFC7181_MPR_FLOODING;
  }

  OONF_DEBUG(LOG_NHDP_W, "Set flooding MPR: %s", lnk->neigh_is_flooding_mpr ? "true" : "false");

  list_for_each_element(&_domain_list, domain, _node) {
    bit_idx = (domain->index + 1) & 7;
    byte_idx = (domain->index + 1) >> 3;

    if (byte_idx >= tlvsize) {
      return 0;
    }
    if (byte_idx + 1 > len) {
      len = byte_idx + 1;
    }

    if (nhdp_domain_get_neighbordata(domain, lnk->neigh)->neigh_is_mpr) {
      tlvvalue[byte_idx] |= (1 << bit_idx);
    }

    OONF_DEBUG(LOG_NHDP_W, "Set routing MPR for domain %u: %s", domain->ext,
      nhdp_domain_get_neighbordata(domain, lnk->neigh)->neigh_is_mpr ? "true" : "false");
  }
  return len;
}